

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFileComparator.cpp
# Opt level: O3

bool __thiscall
ApprovalTests::TextFileComparator::contentsAreEquivalent
          (TextFileComparator *this,string *receivedPath,string *approvedPath)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ifstream rstream;
  ifstream astream;
  long local_428 [4];
  int aiStack_408 [122];
  long local_220 [4];
  int aiStack_200 [122];
  
  ::std::ifstream::ifstream(local_220,(approvedPath->_M_dataplus)._M_p,_S_in|_S_bin);
  ::std::ifstream::ifstream(local_428,(receivedPath->_M_dataplus)._M_p,_S_in|_S_bin);
  do {
    bVar3 = true;
    if ((*(int *)((long)aiStack_200 + *(long *)(local_220[0] + -0x18)) != 0) ||
       (*(int *)((long)aiStack_408 + *(long *)(local_428[0] + -0x18)) != 0)) goto LAB_00167d00;
    iVar1 = ::std::istream::get();
    if (iVar1 == 0xd) {
      iVar1 = ::std::istream::get();
    }
    iVar2 = ::std::istream::get();
    if (iVar2 == 0xd) {
      iVar2 = ::std::istream::get();
    }
  } while (iVar1 == iVar2);
  bVar3 = false;
LAB_00167d00:
  ::std::ifstream::~ifstream(local_428);
  ::std::ifstream::~ifstream(local_220);
  return bVar3;
}

Assistant:

bool TextFileComparator::contentsAreEquivalent(std::string receivedPath,
                                                   std::string approvedPath) const
    {
        std::ifstream astream(approvedPath.c_str(), std::ios::binary | std::ifstream::in);
        std::ifstream rstream(receivedPath.c_str(), std::ios::binary | std::ifstream::in);

        while (astream.good() && rstream.good())
        {
            int a = getNextRelevantCharacter(astream);
            int r = getNextRelevantCharacter(rstream);

            if (a != r)
            {
                return false;
            }
        }
        return true;
    }